

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool __thiscall FlowGraph::DoesExitLabelDominate(FlowGraph *this,BranchInstr *leaveInstr)

{
  OpCode *pOVar1;
  IRKind IVar2;
  OpCode OVar3;
  LabelInstr *this_00;
  Region *region1;
  code *pcVar4;
  bool bVar5;
  Instr *pIVar6;
  undefined4 *puVar7;
  Type *ppLVar8;
  FlowGraph *this_01;
  Instr *pIVar9;
  
  this_00 = leaveInstr->m_branchTarget;
  pIVar6 = IR::Instr::GetNextRealInstr(&this_00->super_Instr);
  if ((pIVar6->m_kind != InstrKindBranch) &&
     (pIVar6 = IR::Instr::GetNextRealInstr(&this_00->super_Instr),
     pIVar6->m_opcode != ProfiledLoopEnd)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x55,
                       "(leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd)"
                       ,
                       "leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd"
                      );
    if (!bVar5) goto LAB_00414346;
    *puVar7 = 0;
  }
  pIVar6 = IR::Instr::GetNextBranchOrLabel(&this_00->super_Instr);
  if (pIVar6->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar5) {
LAB_00414346:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    OVar3 = pIVar6->m_opcode;
    if ((OVar3 != Leave) && (OVar3 != BrOnException)) {
      pIVar9 = pIVar6;
      if (OVar3 == Br) break;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x5a,
                         "(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException)"
                         ,
                         "leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException"
                        );
      if (!bVar5) goto LAB_00414346;
      *puVar7 = 0;
    }
    pIVar9 = pIVar6->m_next;
    IVar2 = pIVar9->m_kind;
    if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar5) goto LAB_00414346;
      *puVar7 = 0;
    }
    pIVar9 = pIVar9->m_next;
    IVar2 = pIVar9->m_kind;
    if ((IVar2 != InstrKindBranch) &&
       (pOVar1 = &pIVar9->m_opcode, pIVar9 = pIVar6, *pOVar1 != ProfiledLoopEnd)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x5f,"(nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd)",
                         "nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd");
      if (!bVar5) goto LAB_00414346;
      *puVar7 = 0;
    }
    pIVar6 = pIVar9;
  } while (IVar2 == InstrKindBranch);
  region1 = (Region *)pIVar9[1].m_next[1].m_src2;
  this_01 = (FlowGraph *)this->finallyLabelStack;
  ppLVar8 = SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                      ((SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *)this_01);
  bVar5 = Dominates(this_01,region1,(*ppLVar8)->m_region);
  return bVar5;
}

Assistant:

bool FlowGraph::DoesExitLabelDominate(IR::BranchInstr *leaveInstr)
{
    IR::LabelInstr * leaveTarget = leaveInstr->GetTarget();
    Assert(leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd);
    IR::BranchInstr *leaveChain = leaveTarget->GetNextBranchOrLabel()->AsBranchInstr();

    while (leaveChain->m_opcode != Js::OpCode::Br)
    {
        Assert(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException);
        IR::LabelInstr * nextLabel = leaveChain->m_next->AsLabelInstr();
        if (!nextLabel->m_next->IsBranchInstr())
        {
            // For jit loop bodies - we can encounter ProfiledLoopEnd before every early return
            Assert(nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd);
            break;
        }
        leaveChain = nextLabel->m_next->AsBranchInstr();
    }
    IR::LabelInstr * exitLabel = leaveChain->GetTarget();
    return Dominates(exitLabel->GetRegion(), finallyLabelStack->Top()->GetRegion());
}